

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O0

Own<capnp::CallContextHook,_std::nullptr_t> __thiscall
capnp::LocalCallContext::addRef(LocalCallContext *this)

{
  CallContextHook *extraout_RDX;
  LocalCallContext *in_RSI;
  Own<capnp::CallContextHook,_std::nullptr_t> OVar1;
  LocalCallContext *this_local;
  
  this_local = this;
  kj::addRef<capnp::LocalCallContext>((kj *)&stack0xffffffffffffffd8,in_RSI);
  kj::Own<capnp::CallContextHook,decltype(nullptr)>::Own<capnp::LocalCallContext,void>
            ((Own<capnp::CallContextHook,decltype(nullptr)> *)this,
             (Own<capnp::LocalCallContext,_std::nullptr_t> *)&stack0xffffffffffffffd8);
  kj::Own<capnp::LocalCallContext,_std::nullptr_t>::~Own
            ((Own<capnp::LocalCallContext,_std::nullptr_t> *)&stack0xffffffffffffffd8);
  OVar1.ptr = extraout_RDX;
  OVar1.disposer = (Disposer *)this;
  return OVar1;
}

Assistant:

kj::Own<CallContextHook> addRef() override {
    return kj::addRef(*this);
  }